

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# encoder.c
# Opt level: O0

int encode_frame_to_data_rate(AV1_COMP *cpi,size_t *size,uint8_t *dest,size_t dest_size)

{
  SequenceHeader *pSVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  AV1_COMMON *cm_00;
  FeatureFlags *pFVar5;
  YV12_BUFFER_CONFIG *pYVar6;
  undefined8 *in_RSI;
  AV1_COMP *in_RDI;
  AV1_COMP *unaff_retaddr;
  int *in_stack_00000018;
  char fn [20];
  AV1_COMP *in_stack_00000038;
  int release_scaled_refs;
  int i_1;
  aom_superres_mode orig_superres_mode;
  int largest_tile_id;
  int msb;
  int lsb;
  DuckyEncodeFrameResult *frame_result;
  PSNR_STATS psnr;
  int i;
  int display_frame_id;
  int largest_tile_id_1;
  GF_GROUP *gf_group;
  TileConfig *tile_cfg;
  FeatureFlags *features;
  segmentation *seg;
  AV1EncoderConfig *oxcf;
  CurrentFrame *current_frame;
  SequenceHeader *seq_params;
  AV1_COMMON *cm;
  FRAME_CONTEXT *in_stack_00000340;
  AV1_COMP *in_stack_fffffffffffffe90;
  int in_stack_fffffffffffffe98;
  undefined3 uVar7;
  uint in_stack_fffffffffffffe9c;
  undefined4 in_stack_fffffffffffffea0;
  uint in_stack_fffffffffffffea4;
  AV1_COMP *in_stack_fffffffffffffeb0;
  undefined4 in_stack_fffffffffffffeb8;
  undefined4 in_stack_fffffffffffffebc;
  int local_134;
  int in_stack_fffffffffffffed0;
  aom_superres_mode aVar8;
  int in_stack_fffffffffffffed4;
  int iVar9;
  undefined4 in_stack_fffffffffffffed8;
  undefined4 in_stack_fffffffffffffedc;
  PSNR_STATS *in_stack_fffffffffffffee0;
  YV12_BUFFER_CONFIG *in_stack_fffffffffffffee8;
  AV1_COMP *in_stack_fffffffffffffef0;
  int64_t local_f8;
  ForceIntegerMVInfo *in_stack_ffffffffffffff18;
  AV1_COMP *in_stack_ffffffffffffff20;
  YV12_BUFFER_CONFIG *in_stack_ffffffffffffff28;
  uint8_t *in_stack_ffffffffffffff30;
  AV1_COMP *in_stack_ffffffffffffff38;
  int64_t *in_stack_ffffffffffffff50;
  int64_t *in_stack_ffffffffffffff58;
  size_t in_stack_ffffffffffffff60;
  uint8_t *in_stack_ffffffffffffff68;
  size_t *in_stack_ffffffffffffff70;
  AV1_COMP *in_stack_ffffffffffffff78;
  int local_74;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  int local_4;
  
  cm_00 = &in_RDI->common;
  pSVar1 = (in_RDI->common).seq_params;
  pFVar5 = &(in_RDI->common).features;
  (in_RDI->td).mb.e_mbd.cur_buf = in_RDI->source;
  calculate_frame_avg_haar_energy(in_stack_fffffffffffffef0);
  ((in_RDI->common).cur_frame)->frame_type = (cm_00->current_frame).frame_type;
  (in_RDI->common).tiles.large_scale = (uint)((in_RDI->oxcf).tile_cfg.enable_large_scale_tile & 1);
  (in_RDI->common).tiles.single_tile_decoding =
       (uint)((in_RDI->oxcf).tile_cfg.enable_single_tile_decoding & 1);
  uVar2 = frame_might_allow_ref_frame_mvs((AV1_COMMON *)in_stack_fffffffffffffe90);
  (in_RDI->common).features.allow_ref_frame_mvs =
       (((in_RDI->common).features.allow_ref_frame_mvs & 1) & uVar2) != 0;
  (in_RDI->common).features.allow_ref_frame_mvs =
       ((in_RDI->common).features.allow_ref_frame_mvs & 1U & (in_RDI->common).tiles.large_scale == 0
       ) != 0;
  in_stack_fffffffffffffea4 = in_stack_fffffffffffffea4 & 0xffffff;
  if (((in_RDI->oxcf).motion_mode_cfg.allow_warped_motion & 1U) != 0) {
    iVar3 = frame_might_allow_warped_motion((AV1_COMMON *)in_stack_fffffffffffffe90);
    in_stack_fffffffffffffea4 = CONCAT13(iVar3 != 0,(int3)in_stack_fffffffffffffea4);
  }
  (in_RDI->common).features.allow_warped_motion = SUB41(in_stack_fffffffffffffea4 >> 0x18,0);
  in_RDI->last_frame_type = (cm_00->current_frame).frame_type;
  iVar3 = frame_is_intra_only(cm_00);
  if (iVar3 != 0) {
    in_RDI->frames_since_last_update = 0;
  }
  iVar3 = frame_is_sframe(cm_00);
  if (iVar3 != 0) {
    (in_RDI->ppi->gf_group).update_type[(in_RDI->ppi->gf_group).size] = '\x02';
  }
  iVar3 = encode_show_existing_frame(cm_00);
  if (iVar3 == 0) {
    iVar3 = is_stat_generation_stage(in_RDI);
    if ((((iVar3 == 0) && (((in_RDI->common).features.allow_screen_content_tools & 1U) != 0)) &&
        (iVar3 = frame_is_intra_only(cm_00), iVar3 == 0)) &&
       ((in_RDI->sf).rt_sf.use_nonrd_pick_mode == 0)) {
      if (((in_RDI->common).seq_params)->force_integer_mv == '\x02') {
        if (in_RDI->unscaled_last_source == (YV12_BUFFER_CONFIG *)0x0) {
          (in_RDI->common).features.cur_frame_force_integer_mv = false;
        }
        else {
          iVar3 = av1_is_integer_mv(in_stack_ffffffffffffff28,
                                    (YV12_BUFFER_CONFIG *)in_stack_ffffffffffffff20,
                                    in_stack_ffffffffffffff18);
          (in_RDI->common).features.cur_frame_force_integer_mv = iVar3 != 0;
        }
      }
      else {
        (in_RDI->common).features.cur_frame_force_integer_mv =
             ((in_RDI->common).seq_params)->force_integer_mv != '\0';
      }
    }
    else {
      (in_RDI->common).features.cur_frame_force_integer_mv = false;
    }
    (in_RDI->td).mb.e_mbd.cur_frame_force_integer_mv =
         (uint)((in_RDI->common).features.cur_frame_force_integer_mv & 1);
    (in_RDI->common).lf.mode_ref_delta_update = '\0';
    iVar3 = frame_is_intra_only(cm_00);
    if (((iVar3 != 0) || (iVar3 = frame_is_sframe(cm_00), iVar3 != 0)) &&
       (av1_reset_segment_features((AV1_COMMON *)in_stack_fffffffffffffe90),
       (in_RDI->common).seg.enabled != '\0')) {
      (in_RDI->common).seg.update_map = '\x01';
      (in_RDI->common).seg.update_data = '\x01';
    }
    if ((in_RDI->oxcf).tile_cfg.mtu == 0) {
      in_RDI->num_tg = (in_RDI->oxcf).tile_cfg.num_tile_groups;
    }
    else {
      in_RDI->num_tg = 1;
    }
    iVar3 = has_no_stats_stage(in_RDI);
    if ((iVar3 != 0) && ((in_RDI->oxcf).rc_cfg.mode == AOM_CBR)) {
      if (((0 < (in_RDI->svc).spatial_layer_id) && ((in_RDI->oxcf).rc_cfg.target_bandwidth == 0)) ||
         (iVar3 = av1_rc_drop_frame((AV1_COMP *)
                                    CONCAT44(in_stack_fffffffffffffebc,in_stack_fffffffffffffeb8)),
         iVar3 != 0)) {
        in_RDI->is_dropped_frame = true;
      }
      if ((in_RDI->is_dropped_frame & 1U) != 0) {
        av1_setup_frame_size(in_stack_fffffffffffffeb0);
        av1_set_mv_search_params(in_stack_fffffffffffffeb0);
        av1_rc_postencode_update_drop_frame((AV1_COMP *)0x23b011);
        release_scaled_references(in_stack_fffffffffffffeb0);
        (in_RDI->ppi->gf_group).is_frame_dropped[in_RDI->gf_frame_index] = true;
        if ((in_RDI->common).show_frame != 0) {
          update_counters_for_show_frame(in_RDI);
        }
        return 0;
      }
    }
    if ((((in_RDI->oxcf).tune_cfg.tuning == AOM_TUNE_SSIM) ||
        ((in_RDI->oxcf).tune_cfg.tuning == AOM_TUNE_IQ)) ||
       ((in_RDI->oxcf).tune_cfg.tuning == AOM_TUNE_SSIMULACRA2)) {
      av1_set_mb_ssim_rdmult_scaling(in_stack_ffffffffffffff20);
    }
    if (((in_RDI->oxcf).q_cfg.deltaq_mode == '\x03') &&
       ((in_RDI->sf).rt_sf.use_nonrd_pick_mode == 0)) {
      av1_init_mb_wiener_var_buffer(in_stack_fffffffffffffe90);
      av1_set_mb_wiener_variance(_orig_superres_mode);
    }
    if ((in_RDI->oxcf).q_cfg.deltaq_mode == '\x04') {
      av1_init_mb_ur_var_buffer(in_stack_fffffffffffffe90);
      av1_set_mb_ur_variance(unaff_retaddr);
    }
    if (pSVar1->frame_id_numbers_present_flag != '\0') {
      if ((in_RDI->common).current_frame_id == -1) {
        if ((in_RDI->source->flags & 8U) == 0) {
          uVar2 = (uint)*(in_RDI->source->field_5).field_0.y_buffer;
          uVar4 = (uint)(in_RDI->source->field_5).buffers[0][1];
        }
        else {
          uVar2 = *(ushort *)((long)(in_RDI->source->field_5).field_0.y_buffer << 1) & 0xff;
          uVar4 = *(ushort *)((long)(in_RDI->source->field_5).field_0.y_buffer * 2 + 2) & 0xff;
        }
        (in_RDI->common).current_frame_id =
             (int)(uVar4 * 0x100 + uVar2) % (1 << ((byte)pSVar1->frame_id_length & 0x1f));
        if ((in_RDI->oxcf).kf_cfg.sframe_dist != 0) {
          (in_RDI->common).current_frame_id = 0x37;
        }
      }
      else {
        (in_RDI->common).current_frame_id =
             ((in_RDI->common).current_frame_id + 1 + (1 << ((byte)pSVar1->frame_id_length & 0x1f)))
             % (1 << ((byte)pSVar1->frame_id_length & 0x1f));
      }
    }
    uVar2 = (uint)(in_RDI->oxcf).algo_cfg.cdf_update_mode;
    if (uVar2 == 0) {
      pFVar5->disable_cdf_update = true;
    }
    else if (uVar2 == 1) {
      if (((((in_RDI->sf).rt_sf.disable_cdf_update_non_reference_frame & 1U) == 0) ||
          ((in_RDI->ppi->rtc_ref).non_reference_frame == 0)) || ((in_RDI->rc).frames_since_key < 3))
      {
        if ((in_RDI->sf).rt_sf.selective_cdf_update == 0) {
          pFVar5->disable_cdf_update = false;
        }
        else {
          iVar3 = selective_disable_cdf_rtc
                            ((AV1_COMP *)
                             CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
          pFVar5->disable_cdf_update = iVar3 != 0;
        }
      }
      else {
        pFVar5->disable_cdf_update = true;
      }
    }
    else if (uVar2 == 2) {
      if (((in_RDI->oxcf).mode == '\0') || ((in_RDI->oxcf).mode == '\x02')) {
        iVar3 = frame_is_intra_only(cm_00);
        uVar7 = (undefined3)in_stack_fffffffffffffe9c;
        in_stack_fffffffffffffe9c = CONCAT13(1,uVar7);
        if (iVar3 == 0) {
          in_stack_fffffffffffffe9c = CONCAT13((in_RDI->common).show_frame != 0,uVar7) ^ 0xff000000;
        }
        pFVar5->disable_cdf_update = (in_stack_fffffffffffffe9c & 0x1000000) == 0;
      }
      else {
        iVar3 = selective_disable_cdf_rtc
                          ((AV1_COMP *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98)
                          );
        pFVar5->disable_cdf_update = iVar3 != 0;
      }
    }
    if (((in_RDI->do_frame_data_update & 1U) == 0) &&
       ((in_RDI->ppi->gf_group).update_type[in_RDI->gf_frame_index] == '\x06')) {
      pFVar5->disable_cdf_update = true;
    }
    if ((((in_RDI->oxcf).tool_cfg.enable_global_motion & 1U) != 0) &&
       (iVar3 = frame_is_intra_only(cm_00), iVar3 == 0)) {
      aom_invalidate_pyramid((ImagePyramid *)0x23b472);
      av1_invalidate_corner_list((CornerList *)0x23b48a);
    }
    iVar9 = 0;
    iVar3 = av1_superres_in_recode_allowed(in_RDI);
    if (iVar3 == 0) {
      aVar8 = in_RDI->superres_mode;
      in_RDI->superres_mode = (in_RDI->oxcf).superres_cfg.superres_mode;
      iVar3 = encode_with_recode_loop_and_filter
                        (in_stack_ffffffffffffff78,in_stack_ffffffffffffff70,
                         in_stack_ffffffffffffff68,in_stack_ffffffffffffff60,
                         in_stack_ffffffffffffff58,in_stack_ffffffffffffff50,
                         (int *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
      if (iVar3 != 0) {
        return 1;
      }
      in_RDI->superres_mode = aVar8;
    }
    else {
      iVar3 = encode_with_and_without_superres
                        (in_stack_00000038,stack0x00000030,(uint8_t *)fn._8_8_,fn._0_8_,
                         in_stack_00000018);
      if (iVar3 != 0) {
        return 1;
      }
    }
    if (pSVar1->frame_id_numbers_present_flag != '\0') {
      for (local_134 = 0; local_134 < 8; local_134 = local_134 + 1) {
        if (((in_RDI->common).current_frame.refresh_frame_flags >> ((byte)local_134 & 0x1f) & 1U) !=
            0) {
          (in_RDI->common).ref_frame_id[local_134] = (in_RDI->common).current_frame_id;
        }
      }
    }
    if ((in_RDI->svc).spatial_layer_id == (in_RDI->svc).number_spatial_layers + -1) {
      (in_RDI->svc).num_encoded_top_layer = (in_RDI->svc).num_encoded_top_layer + 1;
    }
    if ((((in_RDI->common).seg.enabled != '\0') && ((in_RDI->common).seg.update_map == '\0')) &&
       ((in_RDI->common).last_frame_seg_map != (uint8_t *)0x0)) {
      memcpy(((in_RDI->common).cur_frame)->seg_map,(in_RDI->common).last_frame_seg_map,
             (long)(((in_RDI->common).cur_frame)->mi_cols * ((in_RDI->common).cur_frame)->mi_rows));
    }
    if (((in_RDI->ppi->gf_group).frame_parallel_level[in_RDI->gf_frame_index] == 0) &&
       (iVar3 = frame_is_intra_only(cm_00), iVar3 == 0)) {
      release_scaled_references(in_stack_fffffffffffffeb0);
    }
    if ((in_RDI->common).show_frame != 0) {
      in_RDI->last_show_frame_buf = (in_RDI->common).cur_frame;
    }
    if ((in_RDI->common).features.refresh_frame_context == '\x01') {
      memcpy((in_RDI->common).fc,&in_RDI->tile_data[iVar9].tctx,0x52fc);
      av1_reset_cdf_symbol_counters(in_stack_00000340);
    }
    if ((in_RDI->common).tiles.large_scale == 0) {
      memcpy(&((in_RDI->common).cur_frame)->frame_context,(in_RDI->common).fc,0x52fc);
    }
    if (((((in_RDI->oxcf).tile_cfg.enable_ext_tile_debug & 1U) != 0) &&
        ((in_RDI->common).tiles.large_scale != 0)) &&
       (iVar3 = is_stat_consumption_stage(in_stack_fffffffffffffe90), iVar3 != 0)) {
      av1_print_frame_contexts
                ((FRAME_CONTEXT *)CONCAT44(in_stack_fffffffffffffea4,uVar2),
                 (char *)CONCAT44(in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98));
    }
    in_RDI->last_frame_type = (cm_00->current_frame).frame_type;
    if (((in_RDI->common).features.disable_cdf_update & 1U) == 0) {
      in_RDI->frames_since_last_update = 1;
    }
    else {
      in_RDI->frames_since_last_update = in_RDI->frames_since_last_update + 1;
    }
    if ((in_RDI->svc).spatial_layer_id == (in_RDI->svc).number_spatial_layers + -1) {
      (in_RDI->svc).prev_number_spatial_layers = (in_RDI->svc).number_spatial_layers;
    }
    (in_RDI->svc).prev_number_temporal_layers = (in_RDI->svc).number_temporal_layers;
    (in_RDI->common).seg.update_map = '\0';
    (in_RDI->common).seg.update_data = '\0';
    (in_RDI->common).lf.mode_ref_delta_update = '\0';
    if ((in_RDI->common).show_frame != 0) {
      update_counters_for_show_frame(in_RDI);
    }
    local_4 = 0;
  }
  else {
    av1_finalize_encoded_frame(in_stack_fffffffffffffeb0);
    (in_RDI->rc).coefficient_size = 0;
    iVar3 = av1_pack_bitstream(in_stack_ffffffffffffff38,in_stack_ffffffffffffff30,
                               (size_t)in_stack_ffffffffffffff28,(size_t *)in_stack_ffffffffffffff20
                               ,(int *)in_stack_ffffffffffffff18);
    if (iVar3 == 0) {
      if ((pSVar1->frame_id_numbers_present_flag != '\0') &&
         ((cm_00->current_frame).frame_type == '\0')) {
        iVar3 = (in_RDI->common).ref_frame_id[in_RDI->existing_fb_idx_to_show];
        for (local_74 = 0; local_74 < 8; local_74 = local_74 + 1) {
          (in_RDI->common).ref_frame_id[local_74] = iVar3;
        }
      }
      if ((in_RDI->common).show_frame != 0) {
        in_RDI->last_show_frame_buf = (in_RDI->common).cur_frame;
      }
      av1_set_target_rate((AV1_COMP *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0),
                          in_stack_fffffffffffffe9c,in_stack_fffffffffffffe98);
      iVar3 = is_psnr_calc_enabled(in_stack_fffffffffffffe90);
      if (iVar3 != 0) {
        pYVar6 = realloc_and_scale_source
                           ((AV1_COMP *)
                            CONCAT44(in_stack_fffffffffffffedc,in_stack_fffffffffffffed8),
                            in_stack_fffffffffffffed4,in_stack_fffffffffffffed0);
        in_RDI->source = pYVar6;
      }
      if (in_RDI->use_ducky_encode != 0) {
        aom_calc_psnr((YV12_BUFFER_CONFIG *)in_stack_fffffffffffffef0,in_stack_fffffffffffffee8,
                      in_stack_fffffffffffffee0);
        (in_RDI->ducky_encode_info).frame_result.global_order_idx =
             ((in_RDI->common).cur_frame)->display_order_hint;
        (in_RDI->ducky_encode_info).frame_result.q_index = (in_RDI->common).quant_params.base_qindex
        ;
        (in_RDI->ducky_encode_info).frame_result.rdmult = (in_RDI->rd).RDMULT;
        (in_RDI->ducky_encode_info).frame_result.rate = (int)*in_RSI << 3;
        (in_RDI->ducky_encode_info).frame_result.dist = local_f8;
        (in_RDI->ducky_encode_info).frame_result.psnr = (double)in_stack_fffffffffffffee8;
      }
      update_counters_for_show_frame(in_RDI);
      local_4 = 0;
    }
    else {
      local_4 = 1;
    }
  }
  return local_4;
}

Assistant:

static int encode_frame_to_data_rate(AV1_COMP *cpi, size_t *size, uint8_t *dest,
                                     size_t dest_size) {
  AV1_COMMON *const cm = &cpi->common;
  SequenceHeader *const seq_params = cm->seq_params;
  CurrentFrame *const current_frame = &cm->current_frame;
  const AV1EncoderConfig *const oxcf = &cpi->oxcf;
  struct segmentation *const seg = &cm->seg;
  FeatureFlags *const features = &cm->features;
  const TileConfig *const tile_cfg = &oxcf->tile_cfg;
  assert(cpi->source != NULL);
  cpi->td.mb.e_mbd.cur_buf = cpi->source;

#if CONFIG_COLLECT_COMPONENT_TIMING
  start_timing(cpi, encode_frame_to_data_rate_time);
#endif

#if !CONFIG_REALTIME_ONLY
  calculate_frame_avg_haar_energy(cpi);
#endif

  // frame type has been decided outside of this function call
  cm->cur_frame->frame_type = current_frame->frame_type;

  cm->tiles.large_scale = tile_cfg->enable_large_scale_tile;
  cm->tiles.single_tile_decoding = tile_cfg->enable_single_tile_decoding;

  features->allow_ref_frame_mvs &= frame_might_allow_ref_frame_mvs(cm);
  // features->allow_ref_frame_mvs needs to be written into the frame header
  // while cm->tiles.large_scale is 1, therefore, "cm->tiles.large_scale=1" case
  // is separated from frame_might_allow_ref_frame_mvs().
  features->allow_ref_frame_mvs &= !cm->tiles.large_scale;

  features->allow_warped_motion = oxcf->motion_mode_cfg.allow_warped_motion &&
                                  frame_might_allow_warped_motion(cm);

  cpi->last_frame_type = current_frame->frame_type;

  if (frame_is_intra_only(cm)) {
    cpi->frames_since_last_update = 0;
  }

  if (frame_is_sframe(cm)) {
    GF_GROUP *gf_group = &cpi->ppi->gf_group;
    // S frame will wipe out any previously encoded altref so we cannot place
    // an overlay frame
    gf_group->update_type[gf_group->size] = GF_UPDATE;
  }

  if (encode_show_existing_frame(cm)) {
#if CONFIG_RATECTRL_LOG && CONFIG_THREE_PASS && CONFIG_BITRATE_ACCURACY
    // TODO(angiebird): Move this into a function.
    if (oxcf->pass == AOM_RC_THIRD_PASS) {
      int frame_coding_idx =
          av1_vbr_rc_frame_coding_idx(&cpi->vbr_rc_info, cpi->gf_frame_index);
      rc_log_frame_encode_param(
          &cpi->rc_log, frame_coding_idx, 1, 255,
          cpi->ppi->gf_group.update_type[cpi->gf_frame_index]);
    }
#endif
    av1_finalize_encoded_frame(cpi);
    // Build the bitstream
    int largest_tile_id = 0;  // Output from bitstream: unused here
    cpi->rc.coefficient_size = 0;
    if (av1_pack_bitstream(cpi, dest, dest_size, size, &largest_tile_id) !=
        AOM_CODEC_OK)
      return AOM_CODEC_ERROR;

    if (seq_params->frame_id_numbers_present_flag &&
        current_frame->frame_type == KEY_FRAME) {
      // Displaying a forward key-frame, so reset the ref buffer IDs
      int display_frame_id = cm->ref_frame_id[cpi->existing_fb_idx_to_show];
      for (int i = 0; i < REF_FRAMES; i++)
        cm->ref_frame_id[i] = display_frame_id;
    }

#if DUMP_RECON_FRAMES == 1
    // NOTE(zoeliu): For debug - Output the filtered reconstructed video.
    av1_dump_filtered_recon_frames(cpi);
#endif  // DUMP_RECON_FRAMES

    // NOTE: Save the new show frame buffer index for --test-code=warn, i.e.,
    //       for the purpose to verify no mismatch between encoder and decoder.
    if (cm->show_frame) cpi->last_show_frame_buf = cm->cur_frame;

#if CONFIG_AV1_TEMPORAL_DENOISING
    av1_denoiser_update_ref_frame(cpi);
#endif

    // Since we allocate a spot for the OVERLAY frame in the gf group, we need
    // to do post-encoding update accordingly.
    av1_set_target_rate(cpi, cm->width, cm->height);

    if (is_psnr_calc_enabled(cpi)) {
      cpi->source =
          realloc_and_scale_source(cpi, cm->cur_frame->buf.y_crop_width,
                                   cm->cur_frame->buf.y_crop_height);
    }

#if !CONFIG_REALTIME_ONLY
    if (cpi->use_ducky_encode) {
      PSNR_STATS psnr;
      aom_calc_psnr(cpi->source, &cpi->common.cur_frame->buf, &psnr);
      DuckyEncodeFrameResult *frame_result =
          &cpi->ducky_encode_info.frame_result;
      frame_result->global_order_idx = cm->cur_frame->display_order_hint;
      frame_result->q_index = cm->quant_params.base_qindex;
      frame_result->rdmult = cpi->rd.RDMULT;
      frame_result->rate = (int)(*size) * 8;
      frame_result->dist = psnr.sse[0];
      frame_result->psnr = psnr.psnr[0];
    }
#endif  // !CONFIG_REALTIME_ONLY

    update_counters_for_show_frame(cpi);
    return AOM_CODEC_OK;
  }

  // Work out whether to force_integer_mv this frame
  if (!is_stat_generation_stage(cpi) &&
      cpi->common.features.allow_screen_content_tools &&
      !frame_is_intra_only(cm) && !cpi->sf.rt_sf.use_nonrd_pick_mode) {
    if (cpi->common.seq_params->force_integer_mv == 2) {
      // Adaptive mode: see what previous frame encoded did
      if (cpi->unscaled_last_source != NULL) {
        features->cur_frame_force_integer_mv = av1_is_integer_mv(
            cpi->source, cpi->unscaled_last_source, &cpi->force_intpel_info);
      } else {
        cpi->common.features.cur_frame_force_integer_mv = 0;
      }
    } else {
      cpi->common.features.cur_frame_force_integer_mv =
          cpi->common.seq_params->force_integer_mv;
    }
  } else {
    cpi->common.features.cur_frame_force_integer_mv = 0;
  }

  // This is used by av1_pack_bitstream. So this needs to be set in case of
  // row-mt where the encoding code will use a temporary structure.
  cpi->td.mb.e_mbd.cur_frame_force_integer_mv =
      cpi->common.features.cur_frame_force_integer_mv;

  // Set default state for segment based loop filter update flags.
  cm->lf.mode_ref_delta_update = 0;

  // Set various flags etc to special state if it is a key frame.
  if (frame_is_intra_only(cm) || frame_is_sframe(cm)) {
    // Reset the loop filter deltas and segmentation map.
    av1_reset_segment_features(cm);

    // If segmentation is enabled force a map update for key frames.
    if (seg->enabled) {
      seg->update_map = 1;
      seg->update_data = 1;
    }
  }
  if (tile_cfg->mtu == 0) {
    cpi->num_tg = tile_cfg->num_tile_groups;
  } else {
    // Use a default value for the purposes of weighting costs in probability
    // updates
    cpi->num_tg = DEFAULT_MAX_NUM_TG;
  }

  // For 1 pass CBR mode: check if we are dropping this frame.
  if (has_no_stats_stage(cpi) && oxcf->rc_cfg.mode == AOM_CBR) {
    // Always drop for spatial enhancement layer if layer bandwidth is 0.
    // Otherwise check for frame-dropping based on buffer level in
    // av1_rc_drop_frame().
    if ((cpi->svc.spatial_layer_id > 0 &&
         cpi->oxcf.rc_cfg.target_bandwidth == 0) ||
        av1_rc_drop_frame(cpi)) {
      cpi->is_dropped_frame = true;
    }
    if (cpi->is_dropped_frame) {
      av1_setup_frame_size(cpi);
      av1_set_mv_search_params(cpi);
      av1_rc_postencode_update_drop_frame(cpi);
      release_scaled_references(cpi);
      cpi->ppi->gf_group.is_frame_dropped[cpi->gf_frame_index] = true;
      // A dropped frame might not be shown but it always takes a slot in the gf
      // group. Therefore, even when it is not shown, we still need to update
      // the relevant frame counters.
      if (cm->show_frame) {
        update_counters_for_show_frame(cpi);
      }
      return AOM_CODEC_OK;
    }
  }

  if (oxcf->tune_cfg.tuning == AOM_TUNE_SSIM ||
      oxcf->tune_cfg.tuning == AOM_TUNE_IQ ||
      oxcf->tune_cfg.tuning == AOM_TUNE_SSIMULACRA2) {
    av1_set_mb_ssim_rdmult_scaling(cpi);
  }
#if CONFIG_SALIENCY_MAP
  else if (oxcf->tune_cfg.tuning == AOM_TUNE_VMAF_SALIENCY_MAP &&
           !(cpi->source->flags & YV12_FLAG_HIGHBITDEPTH)) {
    if (av1_set_saliency_map(cpi) == 0) {
      return AOM_CODEC_MEM_ERROR;
    }
#if !CONFIG_REALTIME_ONLY
    double motion_ratio = av1_setup_motion_ratio(cpi);
#else
    double motion_ratio = 1.0;
#endif
    if (av1_setup_sm_rdmult_scaling_factor(cpi, motion_ratio) == 0) {
      return AOM_CODEC_MEM_ERROR;
    }
  }
#endif
#if CONFIG_TUNE_VMAF
  else if (oxcf->tune_cfg.tuning == AOM_TUNE_VMAF_WITHOUT_PREPROCESSING ||
           oxcf->tune_cfg.tuning == AOM_TUNE_VMAF_MAX_GAIN ||
           oxcf->tune_cfg.tuning == AOM_TUNE_VMAF_NEG_MAX_GAIN) {
    av1_set_mb_vmaf_rdmult_scaling(cpi);
  }
#endif

  if (cpi->oxcf.q_cfg.deltaq_mode == DELTA_Q_PERCEPTUAL_AI &&
      cpi->sf.rt_sf.use_nonrd_pick_mode == 0) {
    av1_init_mb_wiener_var_buffer(cpi);
    av1_set_mb_wiener_variance(cpi);
  }

  if (cpi->oxcf.q_cfg.deltaq_mode == DELTA_Q_USER_RATING_BASED) {
    av1_init_mb_ur_var_buffer(cpi);
    av1_set_mb_ur_variance(cpi);
  }

#if CONFIG_INTERNAL_STATS
  memset(cpi->mode_chosen_counts, 0,
         MAX_MODES * sizeof(*cpi->mode_chosen_counts));
#endif

  if (seq_params->frame_id_numbers_present_flag) {
    /* Non-normative definition of current_frame_id ("frame counter" with
     * wraparound) */
    if (cm->current_frame_id == -1) {
      int lsb, msb;
      /* quasi-random initialization of current_frame_id for a key frame */
      if (cpi->source->flags & YV12_FLAG_HIGHBITDEPTH) {
        lsb = CONVERT_TO_SHORTPTR(cpi->source->y_buffer)[0] & 0xff;
        msb = CONVERT_TO_SHORTPTR(cpi->source->y_buffer)[1] & 0xff;
      } else {
        lsb = cpi->source->y_buffer[0] & 0xff;
        msb = cpi->source->y_buffer[1] & 0xff;
      }
      cm->current_frame_id =
          ((msb << 8) + lsb) % (1 << seq_params->frame_id_length);

      // S_frame is meant for stitching different streams of different
      // resolutions together, so current_frame_id must be the
      // same across different streams of the same content current_frame_id
      // should be the same and not random. 0x37 is a chosen number as start
      // point
      if (oxcf->kf_cfg.sframe_dist != 0) cm->current_frame_id = 0x37;
    } else {
      cm->current_frame_id =
          (cm->current_frame_id + 1 + (1 << seq_params->frame_id_length)) %
          (1 << seq_params->frame_id_length);
    }
  }

  switch (oxcf->algo_cfg.cdf_update_mode) {
    case 0:  // No CDF update for any frames(4~6% compression loss).
      features->disable_cdf_update = 1;
      break;
    case 1:  // Enable CDF update for all frames.
      if (cpi->sf.rt_sf.disable_cdf_update_non_reference_frame &&
          cpi->ppi->rtc_ref.non_reference_frame && cpi->rc.frames_since_key > 2)
        features->disable_cdf_update = 1;
      else if (cpi->sf.rt_sf.selective_cdf_update)
        features->disable_cdf_update = selective_disable_cdf_rtc(cpi);
      else
        features->disable_cdf_update = 0;
      break;
    case 2:
      // Strategically determine at which frames to do CDF update.
      // Currently only enable CDF update for all-intra and no-show frames(1.5%
      // compression loss) for good qualiy or allintra mode.
      if (oxcf->mode == GOOD || oxcf->mode == ALLINTRA) {
        features->disable_cdf_update =
            (frame_is_intra_only(cm) || !cm->show_frame) ? 0 : 1;
      } else {
        features->disable_cdf_update = selective_disable_cdf_rtc(cpi);
      }
      break;
  }

  // Disable cdf update for the INTNL_ARF_UPDATE frame with
  // frame_parallel_level 1.
  if (!cpi->do_frame_data_update &&
      cpi->ppi->gf_group.update_type[cpi->gf_frame_index] == INTNL_ARF_UPDATE) {
    assert(cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] == 1);
    features->disable_cdf_update = 1;
  }

#if !CONFIG_REALTIME_ONLY
  if (cpi->oxcf.tool_cfg.enable_global_motion && !frame_is_intra_only(cm)) {
    // Flush any stale global motion information, which may be left over
    // from a previous frame
    aom_invalidate_pyramid(cpi->source->y_pyramid);
    av1_invalidate_corner_list(cpi->source->corners);
  }
#endif  // !CONFIG_REALTIME_ONLY

  int largest_tile_id = 0;
  if (av1_superres_in_recode_allowed(cpi)) {
    if (encode_with_and_without_superres(cpi, size, dest, dest_size,
                                         &largest_tile_id) != AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }
  } else {
    const aom_superres_mode orig_superres_mode = cpi->superres_mode;  // save
    cpi->superres_mode = cpi->oxcf.superres_cfg.superres_mode;
    if (encode_with_recode_loop_and_filter(cpi, size, dest, dest_size, NULL,
                                           NULL,
                                           &largest_tile_id) != AOM_CODEC_OK) {
      return AOM_CODEC_ERROR;
    }
    cpi->superres_mode = orig_superres_mode;  // restore
  }

  // Update reference frame ids for reference frames this frame will overwrite
  if (seq_params->frame_id_numbers_present_flag) {
    for (int i = 0; i < REF_FRAMES; i++) {
      if ((current_frame->refresh_frame_flags >> i) & 1) {
        cm->ref_frame_id[i] = cm->current_frame_id;
      }
    }
  }

  if (cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1)
    cpi->svc.num_encoded_top_layer++;

#if DUMP_RECON_FRAMES == 1
  // NOTE(zoeliu): For debug - Output the filtered reconstructed video.
  av1_dump_filtered_recon_frames(cpi);
#endif  // DUMP_RECON_FRAMES

  if (cm->seg.enabled) {
    if (cm->seg.update_map == 0 && cm->last_frame_seg_map) {
      memcpy(cm->cur_frame->seg_map, cm->last_frame_seg_map,
             cm->cur_frame->mi_cols * cm->cur_frame->mi_rows *
                 sizeof(*cm->cur_frame->seg_map));
    }
  }

  int release_scaled_refs = 0;
#if CONFIG_FPMT_TEST
  release_scaled_refs =
      (cpi->ppi->fpmt_unit_test_cfg == PARALLEL_SIMULATION_ENCODE) ? 1 : 0;
#endif  // CONFIG_FPMT_TEST
  if (release_scaled_refs ||
      cpi->ppi->gf_group.frame_parallel_level[cpi->gf_frame_index] == 0) {
    if (frame_is_intra_only(cm) == 0) {
      release_scaled_references(cpi);
    }
  }
#if CONFIG_AV1_TEMPORAL_DENOISING
  av1_denoiser_update_ref_frame(cpi);
#endif

  // NOTE: Save the new show frame buffer index for --test-code=warn, i.e.,
  //       for the purpose to verify no mismatch between encoder and decoder.
  if (cm->show_frame) cpi->last_show_frame_buf = cm->cur_frame;

  if (features->refresh_frame_context == REFRESH_FRAME_CONTEXT_BACKWARD) {
    *cm->fc = cpi->tile_data[largest_tile_id].tctx;
    av1_reset_cdf_symbol_counters(cm->fc);
  }
  if (!cm->tiles.large_scale) {
    cm->cur_frame->frame_context = *cm->fc;
  }

  if (tile_cfg->enable_ext_tile_debug) {
    // (yunqing) This test ensures the correctness of large scale tile coding.
    if (cm->tiles.large_scale && is_stat_consumption_stage(cpi)) {
      char fn[20] = "./fc";
      fn[4] = current_frame->frame_number / 100 + '0';
      fn[5] = (current_frame->frame_number % 100) / 10 + '0';
      fn[6] = (current_frame->frame_number % 10) + '0';
      fn[7] = '\0';
      av1_print_frame_contexts(cm->fc, fn);
    }
  }

  cpi->last_frame_type = current_frame->frame_type;

  if (cm->features.disable_cdf_update) {
    cpi->frames_since_last_update++;
  } else {
    cpi->frames_since_last_update = 1;
  }

  if (cpi->svc.spatial_layer_id == cpi->svc.number_spatial_layers - 1) {
    cpi->svc.prev_number_spatial_layers = cpi->svc.number_spatial_layers;
  }
  cpi->svc.prev_number_temporal_layers = cpi->svc.number_temporal_layers;

  // Clear the one shot update flags for segmentation map and mode/ref loop
  // filter deltas.
  cm->seg.update_map = 0;
  cm->seg.update_data = 0;
  cm->lf.mode_ref_delta_update = 0;

  if (cm->show_frame) {
    update_counters_for_show_frame(cpi);
  }

#if CONFIG_COLLECT_COMPONENT_TIMING
  end_timing(cpi, encode_frame_to_data_rate_time);
#endif

  return AOM_CODEC_OK;
}